

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::disconnect(Federate *this)

{
  ConnectorFederateManager *this_00;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  finalize(this);
  this_00 = (this->cManager)._M_t.
            super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
            .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
  if (this_00 != (ConnectorFederateManager *)0x0) {
    ConnectorFederateManager::disconnect(this_00);
  }
  CoreFactory::getEmptyCore();
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void Federate::disconnect()
{
    finalize();
    if (cManager) {
        cManager->disconnect();
    }
    coreObject = CoreFactory::getEmptyCore();
}